

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardDemodulation.cpp
# Opt level: O3

BwSimplificationRecord __thiscall
Inferences::BackwardDemodulation::ResultFn::operator()
          (ResultFn *this,
          pair<Kernel::TermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
          *arg)

{
  Literal ***pppLVar1;
  ResultSubstitution *pRVar2;
  TermLiteralClause *pTVar3;
  TermList lhs;
  TermList rwTerm;
  Ordering *pOVar4;
  Self SVar5;
  uint uVar6;
  int iVar7;
  Entry *pEVar8;
  TermList TVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Literal *pLVar10;
  Literal **ppLVar11;
  Clause *unit;
  InferenceExtra *extra;
  void **head;
  RefCounter *pRVar12;
  ulong uVar13;
  uint uVar14;
  Clause *pCVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  BwSimplificationRecord BVar20;
  RStack<Literal_*> resLits;
  Applicator appl;
  SmartPtr<Indexing::ResultSubstitution> subs;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause> qr;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_f8;
  RefCounter *local_e8;
  uint64_t local_e0;
  undefined1 uStack_d8;
  SubstApplicator *local_d0;
  uint64_t local_c8;
  uint uStack_c0;
  undefined8 local_b8;
  SubstApplicator local_b0;
  ResultSubstitution *local_a8;
  ResultSubstitution *local_a0;
  RefCounter *local_98;
  ResultSubstitution *local_90;
  RefCounter *local_88;
  TermLiteralClause *local_80;
  SimplifyingInference2 local_78;
  Inference local_60;
  
  pRVar2 = (arg->second).unifier._obj;
  pRVar12 = (arg->second).unifier._refCnt;
  bVar17 = pRVar2 != (ResultSubstitution *)0x0;
  bVar18 = pRVar12 != (RefCounter *)0x0;
  if (bVar18 && bVar17) {
    pRVar12->_val = pRVar12->_val + 1;
  }
  pTVar3 = (arg->second).data;
  pCVar15 = this->_cl;
  uVar14 = (uint)*(undefined8 *)&pCVar15->field_0x38;
  local_90 = pRVar2;
  local_88 = pRVar12;
  local_80 = pTVar3;
  if ((~uVar14 & 0x300000) == 0) {
    Kernel::Clause::computeColor(pCVar15);
    uVar14 = (uint)*(undefined8 *)&pCVar15->field_0x38;
  }
  pCVar15 = pTVar3->clause;
  uVar6 = (uint)*(undefined8 *)&pCVar15->field_0x38;
  if ((~uVar6 & 0x300000) == 0) {
    Kernel::Clause::computeColor(pCVar15);
    uVar6 = (uint)*(undefined8 *)&pCVar15->field_0x38;
  }
  if ((((~(uVar6 | uVar14) & 0x300000) == 0) || (this->_cl == pTVar3->clause)) ||
     (pEVar8 = Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::findEntry
                         ((this->_removed)._obj,pTVar3->clause), pEVar8 != (Entry *)0x0)) {
    unit = (Clause *)0x0;
    pCVar15 = (Clause *)0x0;
    goto LAB_004a7835;
  }
  lhs._content = (arg->first)._content;
  TVar9 = Kernel::EqHelper::getOtherEqualitySide(this->_eqLit,lhs);
  if (bVar18 && bVar17) {
    pRVar12->_val = pRVar12->_val + 1;
  }
  local_b0._vptr_SubstApplicator = (_func_int **)&PTR__SubstApplicator_00b370b8;
  rwTerm._content = (pTVar3->term).super_TermList._content;
  pOVar4 = this->_ordering;
  uStack_c0 = uStack_c0 & 0xffffff00;
  local_b8 = 0;
  bVar19 = (TVar9._content & 1) != 0;
  local_e0 = TVar9._content;
  local_c8 = rwTerm._content;
  local_a8 = pRVar2;
  local_a0 = pRVar2;
  local_98 = pRVar12;
  if (bVar19) {
    iVar7 = (*pRVar2->_vptr_ResultSubstitution[0x12])
                      (pRVar2,(ulong)((uint)TVar9._content & 0xfffffffd));
    local_e0 = CONCAT44(extraout_var,iVar7);
  }
  uStack_d8 = !bVar19;
  local_d0 = &local_b0;
  iVar7 = (*pOVar4->_vptr_Ordering[5])(pOVar4);
  if (iVar7 == 1) {
    TVar9._content._0_4_ = (*pRVar2->_vptr_ResultSubstitution[0x12])(pRVar2,TVar9._content);
    TVar9._content._4_4_ = extraout_var_00;
    bVar19 = DemodulationHelper::redundancyCheckNeededForPremise
                       (this->_helper,pTVar3->clause,pTVar3->literal,rwTerm);
    if ((!bVar19) ||
       (bVar19 = DemodulationHelper::isPremiseRedundant
                           (this->_helper,pTVar3->clause,pTVar3->literal,rwTerm,TVar9,lhs,&local_b0)
       , bVar19)) {
      pLVar10 = Kernel::EqHelper::replace(pTVar3->literal,rwTerm,TVar9);
      if (((pLVar10->super_Term)._functor != 0) ||
         ((((pLVar10->super_Term)._args[0]._content & 4) == 0 ||
          (uVar13 = (ulong)(*(uint *)&(pLVar10->super_Term).field_0xc & 0xfffffff),
          (pLVar10->super_Term)._args[uVar13]._content !=
          (pLVar10->super_Term)._args[uVar13 - 1]._content)))) {
        uVar13 = *(ulong *)&pTVar3->clause->field_0x38;
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        Recycled(&local_f8);
        SVar5._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                )local_f8._self;
        ppLVar11 = *(Literal ***)
                    ((long)local_f8._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                           _M_head_impl + 0x10);
        if (ppLVar11 ==
            *(Literal ***)
             ((long)local_f8._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
             0x18)) {
          Lib::Stack<Kernel::Literal_*>::expand
                    ((Stack<Kernel::Literal_*> *)
                     local_f8._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
          ppLVar11 = *(Literal ***)
                      ((long)SVar5._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                             _M_head_impl + 0x10);
        }
        *ppLVar11 = pLVar10;
        pppLVar1 = (Literal ***)
                   ((long)SVar5._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x10);
        *pppLVar1 = *pppLVar1 + 1;
        uVar13 = uVar13 & 0xfffff;
        local_e8 = pRVar12;
        if (uVar13 != 0) {
          uVar16 = 0;
          do {
            SVar5._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                 local_f8._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
            pLVar10 = pTVar3->clause->_literals[uVar16];
            if (pLVar10 != pTVar3->literal) {
              ppLVar11 = *(Literal ***)
                          ((long)local_f8._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                 _M_head_impl + 0x10);
              if (ppLVar11 ==
                  *(Literal ***)
                   ((long)local_f8._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x18)) {
                Lib::Stack<Kernel::Literal_*>::expand
                          ((Stack<Kernel::Literal_*> *)
                           local_f8._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                           _M_head_impl);
                ppLVar11 = *(Literal ***)
                            ((long)SVar5._M_t.
                                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                   _M_head_impl + 0x10);
              }
              *ppLVar11 = pLVar10;
              pppLVar1 = (Literal ***)
                         ((long)SVar5._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x10);
              *pppLVar1 = *pppLVar1 + 1;
            }
            uVar16 = uVar16 + 1;
          } while (uVar13 != uVar16);
        }
        *(int *)(DAT_00b521c0 + 0x150) = *(int *)(DAT_00b521c0 + 0x150) + 1;
        Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                  ((this->_removed)._obj,pTVar3->clause,1);
        pRVar12 = local_e8;
        local_78.premise1 = pTVar3->clause;
        local_78.premise2 = this->_cl;
        local_78.rule = BACKWARD_DEMODULATION;
        Kernel::Inference::Inference(&local_60,&local_78);
        unit = Kernel::Clause::fromStack
                         ((Stack<Kernel::Literal_*> *)
                          local_f8._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl,&local_60);
        if (*(int *)(Lib::env + 0x85a8) == 2) {
          extra = (InferenceExtra *)::operator_new(0x18);
          extra->_vptr_InferenceExtra = (_func_int **)&PTR__InferenceExtra_00b3a620;
          extra[1]._vptr_InferenceExtra = (_func_int **)lhs._content;
          extra[2]._vptr_InferenceExtra = (_func_int **)rwTerm._content;
          Lib::ProofExtra::insert((ProofExtra *)&DAT_00b521d8,&unit->super_Unit,extra);
        }
        pCVar15 = pTVar3->clause;
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled(&local_f8);
        goto LAB_004a7b6a;
      }
      *(int *)(DAT_00b521c0 + 0x154) = *(int *)(DAT_00b521c0 + 0x154) + 1;
      Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                ((this->_removed)._obj,pTVar3->clause,1);
      pCVar15 = pTVar3->clause;
    }
    else {
      pCVar15 = (Clause *)0x0;
    }
    unit = (Clause *)0x0;
  }
  else {
    unit = (Clause *)0x0;
    pCVar15 = (Clause *)0x0;
LAB_004a7b6a:
    if (pRVar2 == (ResultSubstitution *)0x0) goto LAB_004a7835;
  }
  if ((pRVar12 != (RefCounter *)0x0) && (pRVar12->_val = pRVar12->_val + -1, pRVar12->_val == 0)) {
    (*pRVar2->_vptr_ResultSubstitution[1])();
    *(undefined8 *)pRVar12 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar12;
  }
LAB_004a7835:
  if ((bVar18 && bVar17) && (pRVar12->_val = pRVar12->_val + -1, pRVar12->_val == 0)) {
    (*pRVar2->_vptr_ResultSubstitution[1])();
    *(undefined8 *)pRVar12 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar12;
  }
  BVar20.replacement = unit;
  BVar20.toRemove = pCVar15;
  return BVar20;
}

Assistant:

BwSimplificationRecord operator() (pair<TermList,QueryRes<ResultSubstitutionSP, TermLiteralClause>> arg)
  {
    auto qr=arg.second;

    if( !ColorHelper::compatible(_cl->color(), qr.data->clause->color()) ) {
      //colors of premises don't match
      return BwSimplificationRecord(0);
    }

    if(_cl==qr.data->clause || _removed->find(qr.data->clause)) {
      //the retreived clause was already replaced during this
      //backward demodulation
      return BwSimplificationRecord(0);
    }

    TermList lhs=arg.first;
    TermList rhs=EqHelper::getOtherEqualitySide(_eqLit, lhs);

    // AYB there used to be a check here to ensure that the sorts
    // matched. This is no longer necessary, as sort matching / unification
    // is handled directly within the tree

    auto subs = qr.unifier;
    ASS(subs->isIdentityOnResultWhenQueryBound());

    Applicator appl(subs.ptr());

    TermList lhsS=qr.data->term;

    if (_ordering.compareUnidirectional(AppliedTerm(lhsS), AppliedTerm(rhs,&appl,true))!=Ordering::GREATER) {
      return BwSimplificationRecord(0);
    }

    TermList rhsS=subs->applyToBoundQuery(rhs);

    if (_helper.redundancyCheckNeededForPremise(qr.data->clause,qr.data->literal,lhsS) &&
      !_helper.isPremiseRedundant(qr.data->clause,qr.data->literal,lhsS,rhsS,lhs,&appl))
    {
      return BwSimplificationRecord(0);
    }

    Literal* resLit=EqHelper::replace(qr.data->literal,lhsS,rhsS);
    if(EqHelper::isEqTautology(resLit)) {
      env.statistics->backwardDemodulationsToEqTaut++;
      _removed->insert(qr.data->clause);
      return BwSimplificationRecord(qr.data->clause);
    }

    unsigned cLen=qr.data->clause->length();
    RStack<Literal*> resLits;

    resLits->push(resLit);

    for(unsigned i=0;i<cLen;i++) {
      Literal* curr=(*qr.data->clause)[i];
      if(curr!=qr.data->literal) {
        resLits->push(curr);
      }
    }

    env.statistics->backwardDemodulations++;
    _removed->insert(qr.data->clause);
    Clause *replacement = Clause::fromStack(
      *resLits,
      SimplifyingInference2(InferenceRule::BACKWARD_DEMODULATION, qr.data->clause, _cl)
    );
    if(env.options->proofExtra() == Options::ProofExtra::FULL)
      env.proofExtra.insert(replacement, new BackwardDemodulationExtra(lhs, lhsS));
    return BwSimplificationRecord(qr.data->clause, replacement);
  }